

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simulator.h
# Opt level: O3

void __thiscall Simulator::read_int_array(Simulator *this,PCode *code)

{
  vector<int,_std::allocator<int>_> *__x;
  int iVar1;
  int iVar2;
  Symbol *pSVar3;
  int input;
  vector<int,_std::allocator<int>_> array;
  int local_4c;
  vector<int,_std::allocator<int>_> local_48;
  
  local_4c = 0;
  pSVar3 = ScopeTree::resolve(&this->tree_,&code->first_);
  std::istream::operator>>((istream *)&std::cin,&local_4c);
  __x = &(pSVar3->value_).int_array;
  std::vector<int,_std::allocator<int>_>::vector(&local_48,__x);
  iVar1 = local_4c;
  iVar2 = get_second_parameter(this,&code->second_);
  local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
  [iVar2] = iVar1;
  std::vector<int,_std::allocator<int>_>::operator=(__x,&local_48);
  pSVar3->is_assigned_ = true;
  this->eip_ = this->eip_ + 1;
  if (local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void Simulator::read_int_array(const PCode &code) {
    int input = 0;
    Symbol &symbol = tree_.resolve(code.first());

    std::cin >> input;
    std::vector<int> array = symbol.int_array();
    array[get_second_parameter(code.second())] = input;
    symbol.set_value(array);
    symbol.set_assigned();

    inc_eip();
}